

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O2

void __thiscall
TPZSkylNSymMatrix<std::complex<float>_>::MultAdd
          (TPZSkylNSymMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
          complex<float> alpha,complex<float> beta,int opt)

{
  complex<float> **ppcVar1;
  complex<float> *pcVar2;
  TPZFMatrix<std::complex<float>_> *this_00;
  ostream *poVar3;
  complex<float> *pcVar4;
  complex<float> *pcVar5;
  long lVar6;
  long lVar7;
  int64_t iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined8 local_c0;
  TPZSkylNSymMatrix<std::complex<float>_> *local_b8;
  TPZFMatrix<std::complex<float>_> *local_b0;
  long local_a8;
  long local_90;
  long local_88;
  long local_80;
  TPZFMatrix<std::complex<float>_> *local_78;
  long local_70;
  long local_68;
  long local_60;
  complex<float> local_58;
  complex<float> local_50;
  float local_48;
  float fStack_44;
  
  iVar10 = (int)alpha._M_value;
  iVar11 = iVar10;
  if (iVar10 == 0) {
    iVar8 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    if (iVar8 == (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)
    goto LAB_00d92b4a;
LAB_00d92b50:
    TPZMatrix<std::complex<float>_>::Error
              ("virtual void TPZSkylNSymMatrix<std::complex<float>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<float>]"
               ," <matrixs with incompatible dimensions>");
    iVar8 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  }
  else {
    iVar8 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
LAB_00d92b4a:
    if ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow != iVar8)
    goto LAB_00d92b50;
  }
  if ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow == iVar8) {
    lVar7 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    lVar9 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    lVar6 = lVar7;
    if (lVar7 == lVar9) goto LAB_00d92b94;
  }
  else {
    lVar9 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  }
  (*(z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xe])(z,iVar8,lVar9);
  lVar7 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  lVar6 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
LAB_00d92b94:
  if ((((lVar6 != (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) ||
       (lVar6 != lVar7)) ||
      (lVar9 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow,
      lVar9 != (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)) ||
     (lVar9 != (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"x.Cols = ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," y.Cols()");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," z.Cols() ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," x.Rows() ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," y.Rows() ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," z.Rows() ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    TPZMatrix<std::complex<float>_>::Error
              ("virtual void TPZSkylNSymMatrix<std::complex<float>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<float>]"
               ," incompatible dimensions\n");
  }
  local_78 = z;
  TPZMatrix<std::complex<float>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<float>_>,y,z,
             (complex<float>)(alpha._M_value & 0xffffffff),iVar11);
  local_70 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  local_88 = (ulong)(iVar10 == 0) * 0x20 + 0x28;
  local_80 = (ulong)(iVar10 != 0) * 0x20 + 0x28;
  local_a8 = 0;
  if (local_70 < 1) {
    local_70 = local_a8;
  }
  local_90 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  if (local_90 < 1) {
    local_90 = local_a8;
  }
  local_b8 = this;
  local_b0 = x;
  for (; local_a8 != local_90; local_a8 = local_a8 + 1) {
    for (lVar9 = 0; lVar9 != local_70; lVar9 = lVar9 + 1) {
      ppcVar1 = (this->fElem).fStore;
      lVar7 = (long)(int)((ulong)((long)ppcVar1[lVar9 + 1] - (long)ppcVar1[lVar9]) >> 3);
      local_c0._0_4_ = 0.0;
      local_c0._4_4_ = 0.0;
      pcVar4 = x->fElem +
               (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * local_a8 +
               (lVar9 - lVar7);
      local_68 = (lVar9 - lVar7) + 1;
      pcVar2 = *(complex<float> **)
                (*(long *)((long)((this->fStorage).fExtAlloc + -0x10) + local_88) + lVar9 * 8);
      local_60 = lVar7 << 3;
      lVar7 = lVar7 * 8;
      while( true ) {
        pcVar4 = pcVar4 + 1;
        pcVar5 = (complex<float> *)((long)&pcVar2[-1]._M_value + lVar7);
        if (pcVar5 <= pcVar2) break;
        std::operator*(pcVar5,pcVar4);
        local_c0._0_4_ = (float)local_c0 + extraout_XMM0_Da;
        local_c0._4_4_ = local_c0._4_4_ + extraout_XMM0_Db;
        lVar7 = lVar7 + -8;
      }
      if (lVar7 + -8 == 0) {
        std::operator*((local_b8->fElem).fStore[lVar9],pcVar4);
        local_c0._0_4_ = (float)local_c0 + extraout_XMM0_Da_00;
        local_c0._4_4_ = local_c0._4_4_ + extraout_XMM0_Db_00;
      }
      std::operator*((complex<float> *)&local_c0,&local_50);
      this_00 = local_78;
      lVar7 = local_a8;
      local_48 = extraout_XMM0_Da_01;
      fStack_44 = extraout_XMM0_Db_01;
      pcVar4 = TPZFMatrix<std::complex<float>_>::operator()(local_78,lVar9,local_a8);
      pcVar4->_M_value =
           CONCAT44((float)(pcVar4->_M_value >> 0x20) + fStack_44,(float)pcVar4->_M_value + local_48
                   );
      pcVar5 = TPZFMatrix<std::complex<float>_>::operator()(this_00,local_68,lVar7);
      local_c0 = local_b0->fElem
                 [(local_b0->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar7
                  + lVar9]._M_value;
      pcVar2 = *(complex<float> **)
                (*(long *)((long)((local_b8->fStorage).fExtAlloc + -0x10) + local_80) + lVar9 * 8);
      pcVar4 = (complex<float> *)((long)&pcVar2->_M_value + local_60);
      while (pcVar4 = pcVar4 + -1, pcVar2 < pcVar4) {
        std::operator*(&local_50,pcVar4);
        std::operator*(&local_58,(complex<float> *)&local_c0);
        pcVar5->_M_value =
             CONCAT44((float)(pcVar5->_M_value >> 0x20) + extraout_XMM0_Db_02,
                      (float)pcVar5->_M_value + extraout_XMM0_Da_02);
        pcVar5 = pcVar5 + 1;
      }
      x = local_b0;
      this = local_b8;
    }
  }
  return;
}

Assistant:

void TPZSkylNSymMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x, const TPZFMatrix<TVar> &y,
  TPZFMatrix<TVar> &z, const TVar alpha, const TVar beta, const int opt)const
{
  // Computes z = beta * y + alpha * opt(this)*x
  // z and x cannot overlap in memory
  if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
    TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,
    " <matrixs with incompatible dimensions>");
  if (z.Rows() != x.Rows() || z.Cols() != x.Cols())
    z.Redim(x.Rows(), x.Cols());
  if (x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows()
    || x.Rows() != z.Rows())
  {
    cout << "x.Cols = " << x.Cols() << " y.Cols()" << y.Cols()
        << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows()
        << " y.Rows() " << y.Rows() << " z.Rows() " << z.Rows() << endl;
    TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, " incompatible dimensions\n");
  }
  this->PrepareZ(y, z, beta, opt);
  int64_t rows = this->Rows();
  int64_t xcols = x.Cols();
  int64_t ic, r;
  for (ic = 0; ic < xcols; ic++)
  {
    for (r = 0; r < rows; r++)
    {
      int64_t offset = Size(r);
      TVar val = 0.;
      const TVar *p = &x.g((r - offset + 1), ic);
        TVar *diag, *diaglast;
        if (opt == 0)
        {
            diag = fElemb[r] + offset - 1;
            diaglast = fElemb[r];
        }
        else
        {
            diag = fElem[r] + offset - 1;
            diaglast = fElem[r];
        }
      while (diag > diaglast)
      {
        val += *diag--**p;
        p ++;
      }
      if (diag == diaglast)
      {
        diag = fElem[r];
        val += *diag * *p;
      }
      z(r, ic) += val * alpha;
      TVar *zp = &z((r - offset + 1), ic);
      val = x.g(r, ic);
        if(opt == 0)
        {
          diag = fElem[r] + offset - 1;
          diaglast = fElem[r];
        }
        else
        {
            diag = fElemb[r] + offset - 1;
            diaglast = fElemb[r];
        }
      while (diag > diaglast)
      {
        *zp += alpha * *diag--*val;
        zp ++;
      }
      //z.Print("z");
    }
  }
}